

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

void __thiscall
lsim::Simulator::write_node(Simulator *this,node_t node_id,Value value,pin_t from_pin)

{
  value_type vVar1;
  value_type vVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  value_type *node_meta;
  value_type local_18;
  pin_t from_pin_local;
  Value value_local;
  node_t node_id_local;
  Simulator *this_local;
  
  node_meta._4_4_ = from_pin;
  local_18 = value;
  from_pin_local = node_id;
  _value_local = this;
  sVar3 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::size(&this->m_node_values_write);
  if (node_id < sVar3) {
    pvVar4 = std::vector<lsim::NodeMetadata,_std::allocator<lsim::NodeMetadata>_>::operator[]
                       (&this->m_node_metadata,(ulong)from_pin_local);
    if (pvVar4->m_time_dirty_write != this->m_time) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_dirty_nodes_write,&from_pin_local);
      pvVar4->m_time_dirty_write = this->m_time;
    }
    if (local_18 == VALUE_UNDEFINED) {
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::erase
                (&pvVar4->m_active_pins,(key_type *)((long)&node_meta + 4));
    }
    else {
      vVar1 = this->m_time;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&this->m_node_write_time,(ulong)from_pin_local);
      vVar2 = local_18;
      *pvVar5 = vVar1;
      pvVar6 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_node_values_write,(ulong)from_pin_local);
      *pvVar6 = vVar2;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                (&pvVar4->m_active_pins,(value_type_conflict1 *)((long)&node_meta + 4));
    }
    return;
  }
  __assert_fail("node_id < m_node_values_write.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xd8,"void lsim::Simulator::write_node(node_t, Value, pin_t)");
}

Assistant:

void Simulator::write_node(node_t node_id, Value value, pin_t from_pin) {
    assert(node_id < m_node_values_write.size());
	auto &node_meta = m_node_metadata[node_id];

	if (node_meta.m_time_dirty_write != m_time) {
		m_dirty_nodes_write.push_back(node_id);
		node_meta.m_time_dirty_write = m_time;
	}

    if (value == VALUE_UNDEFINED) {
        // remove from active pin list
		node_meta.m_active_pins.erase(from_pin);
        return;
    }

    m_node_write_time[node_id] = m_time;
    m_node_values_write[node_id] = value;
    node_meta.m_active_pins.insert(from_pin);
}